

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O1

Value * __thiscall flow::IRBuilder::createB2S(IRBuilder *this,Value *rhs,string *name)

{
  long lVar1;
  char *pcVar2;
  ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
  *unaff_R12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Value *local_38;
  LiteralType local_2c;
  
  local_38 = rhs;
  if (rhs->type_ == Boolean) {
    if (rhs == (Value *)0x0) {
      lVar1 = 0;
    }
    else {
      lVar1 = __dynamic_cast(rhs,&Value::typeinfo,
                             &ConstantValue<bool,(flow::LiteralType)1>::typeinfo,0);
    }
    if (lVar1 != 0) {
      pcVar2 = "false";
      if ((ulong)*(byte *)(lVar1 + 0x48) != 0) {
        pcVar2 = "true";
      }
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,pcVar2,pcVar2 + ((ulong)*(byte *)(lVar1 + 0x48) ^ 5));
      unaff_R12 = IRProgram::
                  get<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>,std::__cxx11::string>
                            (this->program_,&this->program_->strings_,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    if (lVar1 == 0) {
      local_2c = String;
      makeName(&local_58,this,name);
      unaff_R12 = (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
                   *)insert<flow::CastInstr,flow::LiteralType,flow::Value*&,std::__cxx11::string>
                               (this,&local_2c,&local_38,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    return (Value *)unaff_R12;
  }
  __assert_fail("rhs->type() == LiteralType::Boolean",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                ,0x23d,"Value *flow::IRBuilder::createB2S(Value *, const std::string &)");
}

Assistant:

Value* IRBuilder::createB2S(Value* rhs, const std::string& name) {
  assert(rhs->type() == LiteralType::Boolean);

  if (auto a = dynamic_cast<ConstantBoolean*>(rhs))
    return get(a->get() ? "true" : "false");

  return insert<CastInstr>(LiteralType::String, rhs, makeName(name));
}